

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O2

int png_icc_check_tag_table
              (png_const_structrp png_ptr,png_const_charp name,png_uint_32 profile_length,
              png_const_bytep profile)

{
  uint uVar1;
  ulong value;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  bool bVar5;
  
  uVar3 = *(uint *)(profile + 0x80);
  uVar3 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  puVar4 = (uint *)(profile + 0x84);
  while( true ) {
    bVar5 = uVar3 == 0;
    uVar3 = uVar3 - 1;
    if (bVar5) {
      return 1;
    }
    uVar1 = *puVar4;
    uVar2 = (uint)*(byte *)((long)puVar4 + 6) << 8 |
            (uint)*(byte *)((long)puVar4 + 5) << 0x10 | (uint)(byte)puVar4[1] << 0x18 |
            (uint)*(byte *)((long)puVar4 + 7);
    value = (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18)
    ;
    if ((profile_length < uVar2) ||
       (uVar1 = puVar4[2],
       profile_length - uVar2 <
       (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18))) break;
    if ((*(byte *)((long)puVar4 + 7) & 3) != 0) {
      png_icc_profile_error(png_ptr,name,value,"ICC profile tag start not a multiple of 4");
    }
    puVar4 = puVar4 + 3;
  }
  png_icc_profile_error(png_ptr,name,value,"ICC profile tag outside profile");
  return 0;
}

Assistant:

int /* PRIVATE */
png_icc_check_tag_table(png_const_structrp png_ptr, png_const_charp name,
   png_uint_32 profile_length,
   png_const_bytep profile /* header plus whole tag table */)
{
   png_uint_32 tag_count = png_get_uint_32(profile+128);
   png_uint_32 itag;
   png_const_bytep tag = profile+132; /* The first tag */

   /* First scan all the tags in the table and add bits to the icc_info value
    * (temporarily in 'tags').
    */
   for (itag=0; itag < tag_count; ++itag, tag += 12)
   {
      png_uint_32 tag_id = png_get_uint_32(tag+0);
      png_uint_32 tag_start = png_get_uint_32(tag+4); /* must be aligned */
      png_uint_32 tag_length = png_get_uint_32(tag+8);/* not padded */

      /* The ICC specification does not exclude zero length tags, therefore the
       * start might actually be anywhere if there is no data, but this would be
       * a clear abuse of the intent of the standard so the start is checked for
       * being in range.  All defined tag types have an 8 byte header - a 4 byte
       * type signature then 0.
       */

      /* This is a hard error; potentially it can cause read outside the
       * profile.
       */
      if (tag_start > profile_length || tag_length > profile_length - tag_start)
         return png_icc_profile_error(png_ptr, name, tag_id,
             "ICC profile tag outside profile");

      if ((tag_start & 3) != 0)
      {
         /* CNHP730S.icc shipped with Microsoft Windows 64 violates this; it is
          * only a warning here because libpng does not care about the
          * alignment.
          */
         (void)png_icc_profile_error(png_ptr, name, tag_id,
             "ICC profile tag start not a multiple of 4");
      }
   }

   return 1; /* success, maybe with warnings */
}